

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O1

S1ChordAngle __thiscall S2Cell::GetDistance(S2Cell *this,S2Cell *target)

{
  bool bVar1;
  int i;
  long lVar2;
  S2Point *a;
  long lVar3;
  S2Point *a_00;
  S2Point *x;
  S2Point vb [4];
  S2Point va [4];
  S1ChordAngle local_128;
  long local_120;
  S2Point *local_118;
  S2Point local_110;
  S2Point local_f8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  S2Point local_98;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((this->face_ == target->face_) && (bVar1 = R2Rect::Intersects(&this->uv_,&target->uv_), bVar1)
     ) {
    S1ChordAngle::S1ChordAngle(&local_128,0.0);
    return (S1ChordAngle)local_128.length2_;
  }
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_98.c_[2] = 0.0;
  uStack_80 = 0;
  local_98.c_[0] = 0.0;
  local_98.c_[1] = 0.0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_f8.c_[2] = 0.0;
  uStack_e0 = 0;
  local_f8.c_[0] = 0.0;
  local_f8.c_[1] = 0.0;
  lVar3 = 0;
  lVar2 = 0;
  do {
    GetVertex(&local_110,this,(int)lVar2);
    *(VType *)((long)local_98.c_ + lVar3 + 0x10) = local_110.c_[2];
    *(VType *)((long)local_98.c_ + lVar3) = local_110.c_[0];
    *(VType *)((long)local_98.c_ + lVar3 + 8) = local_110.c_[1];
    GetVertex(&local_110,target,(int)lVar2);
    *(VType *)((long)local_f8.c_ + lVar3 + 0x10) = local_110.c_[2];
    *(VType *)((long)local_f8.c_ + lVar3) = local_110.c_[0];
    *(VType *)((long)local_f8.c_ + lVar3 + 8) = local_110.c_[1];
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0x18;
  } while (lVar2 != 4);
  S1ChordAngle::S1ChordAngle(&local_128,INFINITY);
  local_120 = 0;
  do {
    local_118 = &local_98 + local_120;
    x = &local_f8 + local_120;
    lVar2 = 1;
    a = &local_f8;
    a_00 = &local_98;
    do {
      lVar3 = (ulong)(((uint)lVar2 & 3) << 3) * 3;
      S2::UpdateMinDistance(local_118,a,(S2Point *)((long)local_f8.c_ + lVar3),&local_128);
      S2::UpdateMinDistance(x,a_00,(S2Point *)((long)local_98.c_ + lVar3),&local_128);
      a_00 = a_00 + 1;
      a = a + 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 5);
    local_120 = local_120 + 1;
  } while (local_120 != 4);
  return (S1ChordAngle)local_128.length2_;
}

Assistant:

S1ChordAngle S2Cell::GetDistance(const S2Cell& target) const {
  // If the cells intersect, the distance is zero.  We use the (u,v) ranges
  // rather S2CellId::intersects() so that cells that share a partial edge or
  // corner are considered to intersect.
  if (face_ == target.face_ && uv_.Intersects(target.uv_)) {
    return S1ChordAngle::Zero();
  }

  // Otherwise, the minimum distance always occurs between a vertex of one
  // cell and an edge of the other cell (including the edge endpoints).  This
  // represents a total of 32 possible (vertex, edge) pairs.
  //
  // TODO(ericv): This could be optimized to be at least 5x faster by pruning
  // the set of possible closest vertex/edge pairs using the faces and (u,v)
  // ranges of both cells.
  S2Point va[4], vb[4];
  for (int i = 0; i < 4; ++i) {
    va[i] = GetVertex(i);
    vb[i] = target.GetVertex(i);
  }
  S1ChordAngle min_dist = S1ChordAngle::Infinity();
  for (int i = 0; i < 4; ++i) {
    for (int j = 0; j < 4; ++j) {
      S2::UpdateMinDistance(va[i], vb[j], vb[(j + 1) & 3], &min_dist);
      S2::UpdateMinDistance(vb[i], va[j], va[(j + 1) & 3], &min_dist);
    }
  }
  return min_dist;
}